

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conditional_entropy.c
# Opt level: O2

double inform_conditional_entropy(int *xs,int *ys,size_t n,int bx,int by,inform_error *err)

{
  inform_dist *joint;
  inform_dist *marginal;
  _Bool _Var1;
  inform_dist *xy;
  inform_dist *x;
  inform_dist *local_48;
  inform_dist *local_40;
  double local_38;
  
  _Var1 = check_arguments(xs,ys,n,bx,by,err);
  if (!_Var1) {
    local_40 = (inform_dist *)0x0;
    local_48 = (inform_dist *)0x0;
    _Var1 = allocate(bx,by,&local_40,&local_48,err);
    marginal = local_40;
    joint = local_48;
    if (!_Var1) {
      accumulate(xs,ys,n,by,local_40,local_48);
      local_38 = inform_shannon_ce(joint,marginal,2.0);
      free_all(&local_40,&local_48);
      return local_38;
    }
  }
  return NAN;
}

Assistant:

double inform_conditional_entropy(int const *xs, int const *ys, size_t n,
    int bx, int by, inform_error *err)
{
    if (check_arguments(xs, ys, n, bx, by, err)) return NAN;

    inform_dist *x = NULL, *xy = NULL;
    if (allocate(bx, by, &x, &xy, err)) return NAN;

    accumulate(xs, ys, n, by, x, xy);

    double ce = inform_shannon_ce(xy, x, 2.0);

    free_all(&x, &xy);

    return ce;
}